

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

region * create_gas_cloud(level *lev,xchar x,xchar y,int radius,int damage,int duration)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  region *reg;
  nhrect *__dest;
  char cVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  ushort uVar10;
  nhrect *__src;
  bool bVar11;
  char local_7a;
  char local_79;
  char local_70;
  
  reg = (region *)calloc(1,0x58);
  (reg->bounding_box).lx = 'c';
  (reg->bounding_box).ly = 'c';
  reg->ttl = -1;
  reg->expire_f = -1;
  reg->can_enter_f = -1;
  reg->enter_f = -1;
  reg->enter_f = -1;
  reg->can_leave_f = -1;
  reg->leave_f = -1;
  reg->inside_f = -1;
  cVar7 = (char)radius + -1;
  bVar8 = cVar7 + y;
  iVar9 = 0;
  if (radius < 1) {
    radius = 0;
  }
  reg->player_flags = '\x02';
  local_79 = 'c';
  bVar1 = 0;
  uVar2 = 0;
  local_7a = 'c';
  uVar10 = 0;
  __src = (nhrect *)0x0;
  while (bVar11 = radius != 0, radius = radius + -1, bVar11) {
    __dest = (nhrect *)malloc((long)(short)uVar10 * 4 + 4);
    if (0 < (short)uVar10) {
      memcpy(__dest,__src,(ulong)uVar10 << 2);
      free(__src);
    }
    uVar3 = (uint)(byte)x + (int)(short)uVar10;
    uVar5 = (uint)(byte)(y - cVar7) + (int)(short)uVar10;
    uVar6 = (uint)(byte)x + iVar9;
    __dest[(short)uVar10] =
         (nhrect)(uVar6 & 0xff | (uVar5 & 0xff) << 8 | (uVar3 & 0xff) << 0x10 | (uint)bVar8 << 0x18)
    ;
    uVar10 = uVar10 + 1;
    reg->nrects = uVar10;
    reg->rects = __dest;
    cVar4 = (char)uVar6;
    if (cVar4 < local_7a) {
      (reg->bounding_box).lx = cVar4;
      local_7a = cVar4;
    }
    cVar4 = (char)uVar5;
    if (cVar4 < local_79) {
      (reg->bounding_box).ly = cVar4;
      local_79 = cVar4;
    }
    local_70 = (char)uVar2;
    if (local_70 < (char)uVar3) {
      (reg->bounding_box).hx = (char)uVar3;
      uVar2 = uVar3;
    }
    if ((char)bVar1 < (char)bVar8) {
      (reg->bounding_box).hy = bVar8;
      bVar1 = bVar8;
    }
    bVar8 = bVar8 - 1;
    iVar9 = iVar9 + -1;
    __src = __dest;
  }
  reg->ttl = (short)duration;
  if (flags.mon_moving == '\0' && in_mklev == '\0') {
    reg->player_flags = '\0';
  }
  reg->inside_f = 0;
  reg->expire_f = 1;
  reg->arg = damage;
  reg->visible = '\x01';
  reg->effect_id = 0x40009;
  add_region(lev,reg);
  return reg;
}

Assistant:

struct region *create_gas_cloud(struct level *lev, xchar x, xchar y,
				int radius, int damage, int duration)
{
    struct region *cloud;
    int i, nrect;
    struct nhrect tmprect;

    cloud = create_region(NULL, 0);
    nrect = radius;
    tmprect.lx = x;
    tmprect.hx = x;
    tmprect.ly = y - (radius - 1);
    tmprect.hy = y + (radius - 1);
    for (i = 0; i < nrect; i++) {
	add_rect_to_reg(cloud, &tmprect);
	tmprect.lx--;
	tmprect.hx++;
	tmprect.ly++;
	tmprect.hy--;
    }
    cloud->ttl = duration;
    if (!in_mklev && !flags.mon_moving)
	set_heros_fault(cloud);		/* assume player has created it */
    cloud->inside_f = INSIDE_GAS_CLOUD;
    cloud->expire_f = EXPIRE_GAS_CLOUD;
    cloud->arg = damage;
    cloud->visible = TRUE;
    cloud->effect_id = dbuf_effect(E_MISC, E_gascloud);
    add_region(lev, cloud);
    return cloud;
}